

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Display.cpp
# Opt level: O2

XIM sf::priv::OpenXIM(void)

{
  XIM p_Var1;
  char *pcVar2;
  char *pcVar3;
  allocator local_51;
  Lock lock;
  string prevXLoc;
  string prevLoc;
  
  Lock::Lock(&lock,(Mutex *)&(anonymous_namespace)::mutex);
  if ((anonymous_namespace)::referenceCountXIM == 0) {
    pcVar2 = setlocale(6,(char *)0x0);
    if (pcVar2 == (char *)0x0) {
      pcVar2 = "";
    }
    std::__cxx11::string::string((string *)&prevLoc,pcVar2,(allocator *)&prevXLoc);
    pcVar3 = (char *)XSetLocaleModifiers(0);
    pcVar2 = "";
    if (pcVar3 != (char *)0x0) {
      pcVar2 = pcVar3;
    }
    std::__cxx11::string::string((string *)&prevXLoc,pcVar2,&local_51);
    setlocale(6,"");
    XSetLocaleModifiers("");
    (anonymous_namespace)::sharedXIM = (XIM)XOpenIM((anonymous_namespace)::sharedDisplay,0,0,0);
    if (prevLoc._M_string_length != 0) {
      setlocale(6,prevLoc._M_dataplus._M_p);
    }
    if (prevXLoc._M_string_length != 0) {
      XSetLocaleModifiers(prevXLoc._M_dataplus._M_p);
    }
    std::__cxx11::string::~string((string *)&prevXLoc);
    std::__cxx11::string::~string((string *)&prevLoc);
  }
  p_Var1 = (anonymous_namespace)::sharedXIM;
  (anonymous_namespace)::referenceCountXIM = (anonymous_namespace)::referenceCountXIM + 1;
  Lock::~Lock(&lock);
  return p_Var1;
}

Assistant:

XIM OpenXIM()
{
    Lock lock(mutex);

    assert(sharedDisplay != NULL);

    if (referenceCountXIM == 0)
    {
        // Create a new XIM instance

        // We need the default (environment) locale and X locale for opening
        // the IM and properly receiving text
        // First save the previous ones (this might be able to be written more elegantly?)
        const char* p;
        std::string prevLoc((p = setlocale(LC_ALL, NULL)) ? p : "");
        std::string prevXLoc((p = XSetLocaleModifiers(NULL)) ? p : "");

        // Set the locales from environment
        setlocale(LC_ALL, "");
        XSetLocaleModifiers("");

        // Create the input context
        sharedXIM = XOpenIM(sharedDisplay, NULL, NULL, NULL);

        // Restore the previous locale
        if (prevLoc.length() != 0)
            setlocale(LC_ALL, prevLoc.c_str());

        if (prevXLoc.length() != 0)
            XSetLocaleModifiers(prevXLoc.c_str());
    }

    referenceCountXIM++;

    return sharedXIM;
}